

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

int nni_url_canonify_uri(char *out)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  long lVar6;
  byte bVar7;
  char cVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  
  lVar13 = 0;
  lVar12 = 0;
LAB_00119ffe:
  for (; cVar8 = out[lVar12], cVar8 == '%'; lVar12 = lVar12 + 3) {
    ppuVar4 = __ctype_b_loc();
    cVar8 = out[lVar12 + 1];
    if ((*(byte *)((long)*ppuVar4 + (long)cVar8 * 2 + 1) & 0x10) == 0) {
      return 3;
    }
    cVar1 = out[lVar12 + 2];
    if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x10) == 0) {
      return 3;
    }
    bVar10 = cVar8 - 0x30;
    if (9 < bVar10) {
      if ((byte)(cVar8 + 0xbfU) < 6) {
        bVar10 = cVar8 - 0x37;
      }
      else {
        bVar10 = cVar8 + 0xa9;
        if (5 < (byte)(cVar8 + 0x9fU)) {
          bVar10 = 0;
        }
      }
    }
    bVar7 = cVar1 - 0x30;
    if (9 < bVar7) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar7 = cVar1 - 0x37;
      }
      else {
        bVar7 = cVar1 + 0xa9;
        if (5 < (byte)(cVar1 + 0x9fU)) {
          bVar7 = 0;
        }
      }
    }
    bVar7 = bVar7 | bVar10 << 4;
    if ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a) {
LAB_0011a0ad:
      out[lVar13] = bVar7;
      lVar13 = lVar13 + 1;
    }
    else {
      if (((((bVar7 == 0x2d) || (bVar7 == 0x5f)) || (bVar7 == 0x7e)) ||
          ((bVar7 == 0x2e || (2 < bVar10 && bVar7 < 0x3a)))) || ((char)(bVar10 << 4) < '\0'))
      goto LAB_0011a0ad;
      out[lVar13] = '%';
      pp_Var5 = __ctype_toupper_loc();
      out[lVar13 + 1] = (char)(*pp_Var5)[(byte)out[lVar12 + 1]];
      out[lVar13 + 2] = (char)(*pp_Var5)[(byte)out[lVar12 + 2]];
      lVar13 = lVar13 + 3;
    }
  }
  if (cVar8 != '\0') {
    lVar12 = lVar12 + 1;
    out[lVar13] = cVar8;
    lVar13 = lVar13 + 1;
    goto LAB_00119ffe;
  }
  out[lVar13] = '\0';
  lVar9 = 0;
  lVar11 = 0;
  bVar2 = false;
  lVar13 = 0;
  lVar12 = 0;
  while( true ) {
    while (cVar8 = out[lVar12], cVar8 == '/') {
      if (bVar2) goto LAB_0011a164;
      out[lVar13] = '/';
      lVar12 = lVar12 + -1;
      do {
        lVar6 = lVar12 + 1;
        lVar12 = lVar12 + 1;
      } while (out[lVar6] == '/');
      lVar13 = lVar13 + 1;
    }
    if (cVar8 == '\0') break;
    lVar9 = lVar12;
    lVar11 = lVar13;
    if ((cVar8 == '#') || (cVar8 == '?')) {
      bVar2 = true;
    }
LAB_0011a164:
    out[lVar11] = cVar8;
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 1;
    lVar13 = lVar11;
    lVar12 = lVar9;
  }
  out[lVar13] = '\0';
  bVar2 = false;
  lVar9 = 0;
  lVar11 = 0;
  lVar13 = lVar11;
  lVar12 = lVar9;
LAB_0011a19b:
  do {
    cVar8 = out[lVar11];
    lVar6 = lVar12;
    lVar14 = lVar11;
    if (cVar8 != '/') {
      if (cVar8 == '\0') {
        out[lVar12] = '\0';
        bVar10 = *out;
        while( true ) {
          if (bVar10 == 0) {
            return 0;
          }
          if ((char)bVar10 < '\0') break;
          out = (char *)((byte *)out + 1);
          bVar10 = *out;
        }
        if ((((bVar10 & 0xe0) != 0xc0) && ((bVar10 & 0xf0) != 0xe0)) && ((bVar10 & 0xf8) != 0xf0)) {
          return 3;
        }
        return 3;
      }
      if ((cVar8 == '#') || (cVar8 == '?')) {
        bVar2 = true;
      }
LAB_0011a271:
      out[lVar6] = cVar8;
      lVar11 = lVar14 + 1;
      lVar9 = lVar6 + 1;
      lVar13 = lVar11;
      lVar12 = lVar9;
      goto LAB_0011a19b;
    }
    lVar6 = lVar9;
    lVar14 = lVar13;
    if (bVar2) goto LAB_0011a271;
    iVar3 = strncmp(out + lVar11,"/..",3);
    if (((iVar3 == 0) && ((ulong)(byte)out[lVar11 + 3] < 0x40)) &&
       ((0x8000800800000001U >> ((ulong)(byte)out[lVar11 + 3] & 0x3f) & 1) != 0)) {
      lVar11 = lVar11 + 3;
      bVar15 = lVar12 != 0;
      lVar6 = lVar12;
      lVar12 = 0;
      if (bVar15) {
        do {
          if (lVar6 == 1) {
            lVar12 = 0;
            break;
          }
          lVar12 = lVar6 + -1;
          lVar14 = lVar6 + -1;
          lVar6 = lVar12;
        } while (out[lVar14] != '/');
      }
    }
    else {
      iVar3 = strncmp(out + lVar11,"/.",2);
      cVar8 = '/';
      lVar6 = lVar12;
      lVar14 = lVar11;
      if (((iVar3 != 0) || (0x3f < (ulong)(byte)out[lVar11 + 2])) ||
         ((0x8000800800000001U >> ((ulong)(byte)out[lVar11 + 2] & 0x3f) & 1) == 0))
      goto LAB_0011a271;
      lVar11 = lVar11 + 2;
    }
  } while( true );
}

Assistant:

int
nni_url_canonify_uri(char *out)
{
	size_t  src, dst;
	uint8_t c;
	int     rv;
	bool    skip;

	// First pass, convert '%xx' for safe characters to unescaped forms.
	src = dst = 0;
	while ((c = out[src]) != 0) {
		if (c == '%') {
			if ((!isxdigit(out[src + 1])) ||
			    (!isxdigit(out[src + 2]))) {
				return (NNG_EINVAL);
			}
			c = url_hex_val(out[src + 1]);
			c *= 16;
			c += url_hex_val(out[src + 2]);
			// If it's a safe character, decode, otherwise leave
			// it alone.  We also decode valid high-bytes for
			// UTF-8, which will let us validate them and use
			// those characters in file names later.
			if (((c >= 'A') && (c <= 'Z')) ||
			    ((c >= 'a') && (c <= 'z')) ||
			    ((c >= '0') && (c <= '9')) || (c == '.') ||
			    (c == '~') || (c == '_') || (c == '-') ||
			    (c >= 0x80)) {
				out[dst++] = (char) c;
			} else {
				out[dst++] = '%';
				out[dst++] = toupper((uint8_t) out[src + 1]);
				out[dst++] = toupper((uint8_t) out[src + 2]);
			}
			src += 3;
			continue;
		} else {
			out[dst++] = out[src++];
		}
	}
	out[dst] = 0;

	// Second pass, eliminate redundant //.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			out[dst++] = '/';
			while (out[src] == '/') {
				src++;
			}
			continue;
		}
		if ((c == '?') || (c == '#')) {
			skip = true;
		}
		out[dst++] = (char) c;
		src++;
	}
	out[dst] = 0;

	// Second pass, reduce /. and /.. elements, but only in the path.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			if ((strncmp(out + src, "/..", 3) == 0) &&
			    (out[src + 3] == 0 || out[src + 3] == '#' ||
			        out[src + 3] == '?' || out[src + 3] == '/')) {

				if (dst > 0) {
					do {
						dst--;
					} while ((dst) && (out[dst] != '/'));
				}
				src += 3;
				continue;
			}
			if ((strncmp(out + src, "/.", 2) == 0) &&
			    (out[src + 2] == 0 || out[src + 2] == '#' ||
			        out[src + 2] == '?' || out[src + 2] == '/')) {
				src += 2; // just skip over it
				continue;
			}
			out[dst++] = '/';
			src++;
		} else {
			if ((c == '?') || (c == '#')) {
				skip = true;
			}
			out[dst++] = (char) c;
			src++;
		}
	}
	out[dst] = 0;

	// Finally lets make sure that the results are valid UTF-8.
	// This guards against using UTF-8 redundancy to break security.
	if ((rv = url_utf8_validate(out)) != 0) {
		return (rv);
	}

	return (0);
}